

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_container_unit.c
# Opt level: O0

size_t populate(uint16_t *buffer,size_t maxsize)

{
  uint64_t uVar1;
  uint64_t uVar2;
  ulong in_RSI;
  long in_RDI;
  size_t i;
  size_t length;
  undefined8 local_20;
  
  uVar1 = splitmix64();
  for (local_20 = 0; local_20 < uVar1 % in_RSI; local_20 = local_20 + 1) {
    uVar2 = splitmix64();
    *(short *)(in_RDI + local_20 * 2) = (short)uVar2;
  }
  return uVar1 % in_RSI;
}

Assistant:

size_t populate(uint16_t* buffer, size_t maxsize) {
    size_t length = splitmix64() % maxsize;
    for (size_t i = 0; i < length; i++) {
        buffer[i] = (uint16_t)splitmix64();
    }
    return length;
}